

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O0

TestAllTypes_NestedMessage * __thiscall
proto2_unittest::TestAllTypes::unsafe_arena_release_optional_nested_message(TestAllTypes *this)

{
  TestAllTypes_NestedMessage *pTVar1;
  uint32_t *puVar2;
  TestAllTypes_NestedMessage *temp;
  TestAllTypes *this_local;
  
  puVar2 = google::protobuf::internal::HasBits<2>::operator[](&(this->field_0)._impl_._has_bits_,0);
  *puVar2 = *puVar2 & 0xffffffdf;
  pTVar1 = (this->field_0)._impl_.optional_nested_message_;
  (this->field_0)._impl_.optional_nested_message_ = (TestAllTypes_NestedMessage *)0x0;
  return pTVar1;
}

Assistant:

TestAllTypes::unsafe_arena_release_optional_nested_message() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  // @@protoc_insertion_point(field_release:proto2_unittest.TestAllTypes.optional_nested_message)

  _impl_._has_bits_[0] &= ~0x00000020u;
  ::proto2_unittest::TestAllTypes_NestedMessage* temp = _impl_.optional_nested_message_;
  _impl_.optional_nested_message_ = nullptr;
  return temp;
}